

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O3

void __thiscall FIX::FileLog::onOutgoing(FileLog *this,string *value)

{
  ostream *poVar1;
  int in_ECX;
  string local_68;
  undefined **local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  DateTime::nowUtc();
  local_40 = local_28;
  uStack_38 = uStack_20;
  local_48 = &PTR__DateTime_001ea8f0;
  UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_68,(UtcTimeStampConvertor *)&local_48,(UtcTimeStamp *)0x9,in_ECX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->m_messages,local_68._M_dataplus._M_p,
                      local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," : ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void onOutgoing( const std::string& value )
  { m_messages << UtcTimeStampConvertor::convert(UtcTimeStamp(), 9) << " : " << value << std::endl; }